

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O0

int ncnn::get_reverse_op_type(int op_type)

{
  int op_type_local;
  int local_4;
  
  if (op_type == 1) {
    local_4 = 7;
  }
  else if (op_type == 3) {
    local_4 = 8;
  }
  else if (op_type == 6) {
    local_4 = 9;
  }
  else if (op_type == 10) {
    local_4 = 0xb;
  }
  else if (op_type == 7) {
    local_4 = 1;
  }
  else if (op_type == 8) {
    local_4 = 3;
  }
  else if (op_type == 9) {
    local_4 = 6;
  }
  else {
    local_4 = op_type;
    if (op_type == 0xb) {
      local_4 = 10;
    }
  }
  return local_4;
}

Assistant:

static int get_reverse_op_type(int op_type)
{
    if (op_type == BinaryOp::Operation_SUB) return BinaryOp::Operation_RSUB;
    if (op_type == BinaryOp::Operation_DIV) return BinaryOp::Operation_RDIV;
    if (op_type == BinaryOp::Operation_POW) return BinaryOp::Operation_RPOW;
    if (op_type == BinaryOp::Operation_ATAN2) return BinaryOp::Operation_RATAN2;
    if (op_type == BinaryOp::Operation_RSUB) return BinaryOp::Operation_SUB;
    if (op_type == BinaryOp::Operation_RDIV) return BinaryOp::Operation_DIV;
    if (op_type == BinaryOp::Operation_RPOW) return BinaryOp::Operation_POW;
    if (op_type == BinaryOp::Operation_RATAN2) return BinaryOp::Operation_ATAN2;
    return op_type;
}